

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object>::deleteGeometry
          (BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object> *this,size_t geomID)

{
  long *plVar1;
  
  if (geomID < (ulong)(*(long *)(*(long *)(this + 0x28) + 0x208) -
                       *(long *)(*(long *)(this + 0x28) + 0x200) >> 3)) {
    plVar1 = *(long **)(*(long *)(this + 0x10) + geomID * 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)(*(long *)(this + 0x10) + geomID * 8) = 0;
      (**(code **)(*plVar1 + 8))();
    }
    plVar1 = *(long **)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(undefined8 *)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8) = 0;
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }